

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall
cfd::core::DescriptorNode::AnalyzeChild(DescriptorNode *this,string *descriptor,uint32_t depth)

{
  char cVar1;
  string *psVar2;
  bool bVar3;
  CfdException *pCVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint32_t depth_work;
  uint local_228;
  uint32_t local_224;
  string *local_220;
  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_> *local_218;
  string *local_210;
  string *local_208;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_200;
  ulong local_1f8;
  ulong local_1f0;
  CfdSourceLocation local_1e8;
  DescriptorNode *local_1c8;
  string *local_1c0;
  string descriptor_main;
  DescriptorNode node;
  
  this->depth_ = depth;
  descriptor_main._M_dataplus._M_p = (pointer)&descriptor_main.field_2;
  descriptor_main._M_string_length = 0;
  descriptor_main.field_2._M_local_buf[0] = '\0';
  node.name_._M_dataplus._M_p = "cfdcore_descriptor.cpp";
  node.name_._M_string_length._0_4_ = 900;
  node.name_.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_4ec523;
  depth_work = depth;
  logger::info<std::__cxx11::string_const&>
            ((CfdSourceLocation *)&node,"AnalyzeChild = {}",descriptor);
  local_220 = &this->value_;
  local_200 = &this->addr_prefixes_;
  local_224 = depth + 1;
  local_210 = &this->parent_kind_;
  local_208 = (string *)&node.parent_kind_;
  local_218 = &this->child_node_;
  local_1c0 = (string *)&this->checksum_;
  uVar5 = 0;
  local_228 = 0;
  uVar7 = 0;
  local_1f8 = 0;
  local_1f0 = (ulong)depth;
  do {
    if (descriptor->_M_string_length <= uVar7) {
      if (((((this->name_)._M_string_length != 0) &&
           (bVar3 = ::std::operator==(&this->name_,"addr"), !bVar3)) &&
          (bVar3 = ::std::operator==(&this->name_,"raw"), !bVar3)) &&
         ((this->child_node_).
          super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this->child_node_).
          super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        node.name_._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        node.name_._M_string_length._0_4_ = 0x3eb;
        node.name_.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_4ec523;
        logger::warn<>((CfdSourceLocation *)&node,"Failed to child node empty.");
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&node,"Failed to child node empty.",(allocator *)&local_1e8);
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&node.name_);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (descriptor_main._M_string_length != 0) {
        CheckChecksum(this,&descriptor_main);
      }
      ::std::__cxx11::string::~string((string *)&descriptor_main);
      return;
    }
    cVar1 = (descriptor->_M_dataplus)._M_p[uVar7];
    switch(cVar1) {
    case '#':
      if ((local_1f8 & 1) == 0) {
        node.name_._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        node.name_._M_string_length._0_4_ = 0x393;
        node.name_.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_4ec523;
        logger::warn<>((CfdSourceLocation *)&node,"Illegal checksum data.");
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&node,"Illegal checksum data.",(allocator *)&local_1e8);
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&node.name_);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::__cxx11::string::substr((ulong)&node,(ulong)descriptor);
      psVar2 = local_1c0;
      ::std::__cxx11::string::operator=(local_1c0,(string *)&node);
      ::std::__cxx11::string::~string((string *)&node);
      uVar5 = uVar7;
      ::std::__cxx11::string::substr((ulong)&node,(ulong)descriptor);
      ::std::__cxx11::string::operator=((string *)&descriptor_main,(string *)&node);
      ::std::__cxx11::string::~string((string *)&node);
      lVar6 = ::std::__cxx11::string::find((char *)psVar2,0x4afcfc);
      local_1f8 = CONCAT71((int7)(uVar5 >> 8),1);
      uVar5 = uVar7;
      if (lVar6 != -1) {
        node.name_._M_dataplus._M_p = "cfdcore_descriptor.cpp";
        node.name_._M_string_length._0_4_ = 0x38e;
        node.name_.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_4ec523;
        logger::warn<>((CfdSourceLocation *)&node,"Illegal data. Multiple \'#\' symbols.");
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&node,"Multiple \'#\' symbols.",(allocator *)&local_1e8);
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&node.name_);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      break;
    case '$':
    case '%':
    case '&':
    case '\'':
    case '*':
    case '+':
      break;
    case '(':
      if (depth_work == (uint32_t)local_1f0) {
        ::std::__cxx11::string::substr((ulong)&node,(ulong)descriptor);
        ::std::__cxx11::string::operator=((string *)this,(string *)&node);
        ::std::__cxx11::string::~string((string *)&node);
        uVar5 = uVar7 + 1;
      }
      else {
        local_228 = (uint)CONCAT71((int7)(local_1f0 >> 8),1);
      }
      node.name_._M_dataplus._M_p = "cfdcore_descriptor.cpp";
      node.name_._M_string_length._0_4_ = 0x3c2;
      node.name_.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_4ec523;
      logger::info<unsigned_int&,std::__cxx11::string&>
                ((CfdSourceLocation *)&node,"Target`(` depth_work={}, name={}",&depth_work,
                 &this->name_);
      depth_work = depth_work + 1;
      break;
    case ')':
      depth_work = depth_work - 1;
      node.name_._M_dataplus._M_p = "cfdcore_descriptor.cpp";
      node.name_._M_string_length._0_4_ = 0x3c7;
      node.name_.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_4ec523;
      logger::info<unsigned_int&>
                ((CfdSourceLocation *)&node,"Target`)` depth_work = {}",&depth_work);
      if (depth_work == (uint32_t)local_1f0) {
        lVar6 = uVar7 - uVar5;
        ::std::__cxx11::string::substr((ulong)&node,(ulong)descriptor);
        ::std::__cxx11::string::operator=((string *)local_220,(string *)&node);
        ::std::__cxx11::string::~string((string *)&node);
        bVar3 = ::std::operator==(&this->name_,"addr");
        local_1f8 = CONCAT71((int7)((ulong)lVar6 >> 8),1);
        uVar5 = uVar7 + 1;
        if ((!bVar3) && (bVar3 = ::std::operator==(&this->name_,"raw"), !bVar3)) {
          DescriptorNode(&node,local_200);
          bVar3 = ::std::operator==(&this->name_,"tr");
          if (bVar3) {
            node.node_type_ = kDescriptorTypeScript;
            ::std::__cxx11::string::_M_assign((string *)&node.value_);
            local_228 = 0;
LAB_0036105b:
            node.depth_ = local_224;
          }
          else {
            if ((local_228 & 1) == 0) {
              node.node_type_ = kDescriptorTypeKey;
              ::std::__cxx11::string::_M_assign((string *)&node.value_);
              goto LAB_0036105b;
            }
            node.node_type_ = kDescriptorTypeScript;
            AnalyzeChild(&node,local_220,local_224);
            local_228 = 0;
          }
          ::std::__cxx11::string::_M_assign(local_208);
          ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
          push_back(local_218,&node);
          local_1e8.filename = "cfdcore_descriptor.cpp";
          local_1e8.line = 0x3e1;
          local_1e8.funcname = "AnalyzeChild";
          logger::info<unsigned_int&,std::__cxx11::string&>
                    (&local_1e8,"Target`)` depth_work={}, child.value={}",&depth_work,&node.value_);
LAB_003610c0:
          ~DescriptorNode(&node);
          uVar5 = uVar7 + 1;
        }
      }
      break;
    case ',':
      if ((local_228 & 1) == 0) {
        bVar3 = ::std::operator==(&this->name_,"multi");
        if ((bVar3) || (bVar3 = ::std::operator==(&this->name_,"sortedmulti"), bVar3)) {
          DescriptorNode(&node,local_200);
          ::std::__cxx11::string::substr((ulong)&local_1e8,(ulong)descriptor);
          ::std::__cxx11::string::operator=((string *)&node.value_,(string *)&local_1e8);
          ::std::__cxx11::string::~string((string *)&local_1e8);
          local_1e8.filename = "cfdcore_descriptor.cpp";
          local_1e8.line = 0x39d;
          local_1e8.funcname = "AnalyzeChild";
          logger::info<std::__cxx11::string&>(&local_1e8,"multisig, node.value_ = {}",&node.value_);
          if ((this->child_node_).
              super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (this->child_node_).
              super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            node.node_type_ = kDescriptorTypeNumber;
            node.number_ = atoi(node.value_._M_dataplus._M_p);
          }
          else {
            node.node_type_ = kDescriptorTypeKey;
          }
          node.depth_ = local_224;
          ::std::__cxx11::string::_M_assign(local_208);
          ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
          push_back(local_218,&node);
          goto LAB_003610c0;
        }
        bVar3 = ::std::operator==(&this->name_,"tr");
        if ((bVar3) &&
           ((this->child_node_).
            super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->child_node_).
            super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          local_1c8 = this;
          DescriptorNode(&node,local_200);
          ::std::__cxx11::string::substr((ulong)&local_1e8,(ulong)descriptor);
          ::std::__cxx11::string::operator=((string *)&node.value_,(string *)&local_1e8);
          ::std::__cxx11::string::~string((string *)&local_1e8);
          node.node_type_ = kDescriptorTypeKey;
          node.depth_ = local_224;
          ::std::__cxx11::string::_M_assign(local_208);
          ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
          push_back(local_218,&node);
          ~DescriptorNode(&node);
          this = local_1c8;
          uVar5 = uVar7 + 1;
        }
      }
      break;
    default:
      if (cVar1 == ' ') {
        uVar5 = uVar5 + 1;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void DescriptorNode::AnalyzeChild(
    const std::string& descriptor, uint32_t depth) {
  bool is_terminate = false;
  size_t offset = 0;
  uint32_t depth_work = depth;
  bool exist_child_node = false;
  depth_ = depth;
  std::string descriptor_main;
  info(CFD_LOG_SOURCE, "AnalyzeChild = {}", descriptor);

  for (size_t idx = 0; idx < descriptor.size(); ++idx) {
    const char& str = descriptor[idx];
    if (str == '#') {
      if (is_terminate) {
        offset = idx;
        checksum_ = descriptor.substr(idx + 1);
        descriptor_main = descriptor.substr(0, idx);
        if (checksum_.find("#") != std::string::npos) {
          warn(CFD_LOG_SOURCE, "Illegal data. Multiple '#' symbols.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Multiple '#' symbols.");
        }
      } else {
        warn(CFD_LOG_SOURCE, "Illegal checksum data.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Illegal checksum data.");
      }
    } else if (str == ',') {
      if (exist_child_node) {
        // through by child node
      } else if ((name_ == "multi") || (name_ == "sortedmulti")) {
        DescriptorNode node(addr_prefixes_);
        node.value_ = descriptor.substr(offset, idx - offset);
        info(CFD_LOG_SOURCE, "multisig, node.value_ = {}", node.value_);
        if (child_node_.empty()) {
          node.node_type_ = DescriptorNodeType::kDescriptorTypeNumber;
          node.number_ = atoi(node.value_.c_str());
        } else {
          node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
        }
        node.depth_ = depth + 1;
        node.parent_kind_ = parent_kind_;
        child_node_.push_back(node);
        offset = idx + 1;
      } else if (name_ == "tr") {
        if (child_node_.empty()) {
          DescriptorNode node(addr_prefixes_);
          node.value_ = descriptor.substr(offset, idx - offset);
          node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
          node.depth_ = depth + 1;
          node.parent_kind_ = parent_kind_;
          child_node_.push_back(node);
          offset = idx + 1;
        }
      } else {
        // ignore for miniscript
        // warn(CFD_LOG_SOURCE, "Illegal command.");
        // throw CfdException(
        //     CfdError::kCfdIllegalArgumentError, "Illegal command.");
      }
    } else if (str == ' ') {
      ++offset;
    } else if (str == '(') {
      if (depth_work == depth) {
        name_ = descriptor.substr(offset, idx - offset);
        offset = idx + 1;
      } else {
        exist_child_node = true;
      }
      info(
          CFD_LOG_SOURCE, "Target`(` depth_work={}, name={}", depth_work,
          name_);
      ++depth_work;
    } else if (str == ')') {
      --depth_work;
      info(CFD_LOG_SOURCE, "Target`)` depth_work = {}", depth_work);
      if (depth_work == depth) {
        value_ = descriptor.substr(offset, idx - offset);
        is_terminate = true;
        offset = idx + 1;
        if ((name_ == "addr") || (name_ == "raw")) {
          // do nothing
        } else {
          DescriptorNode node(addr_prefixes_);
          if (name_ == "tr") {
            node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
            node.value_ = value_;
            node.depth_ = depth + 1;
            exist_child_node = false;
          } else if (exist_child_node) {
            node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
            node.AnalyzeChild(value_, depth + 1);
            exist_child_node = false;
          } else {
            node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
            node.value_ = value_;
            node.depth_ = depth + 1;
          }
          node.parent_kind_ = parent_kind_;
          child_node_.push_back(node);
          info(
              CFD_LOG_SOURCE, "Target`)` depth_work={}, child.value={}",
              depth_work, node.value_);
        }
      }
    }
  }

  if (name_.empty() || (name_ == "addr") || (name_ == "raw")) {
    // do nothing
  } else if (child_node_.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to child node empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to child node empty.");
  }

  if (!descriptor_main.empty()) {
    CheckChecksum(descriptor_main);
  }
}